

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkaccessmanager.cpp
# Opt level: O3

void __thiscall
QNetworkAccessManagerPrivate::authenticationRequired
          (QNetworkAccessManagerPrivate *this,QAuthenticator *authenticator,QNetworkReply *reply,
          bool synchronous,QUrl *url,QUrl *urlForLastAuthentication,bool allowAuthenticationReuse)

{
  QObject *pQVar1;
  char cVar2;
  byte bVar3;
  long in_FS_OFFSET;
  QStringView QVar4;
  QStringView QVar5;
  QStringView QVar6;
  QStringView QVar7;
  QStringView QVar8;
  QStringView QVar9;
  QStringView QVar10;
  QStringView QVar11;
  QNetworkAuthenticationCredential cred;
  QString local_100;
  QArrayData *local_e8;
  storage_type_conflict *local_e0;
  long local_d8;
  QString local_d0;
  QString local_b8;
  QString local_a0;
  QNetworkAuthenticationCredential local_88;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = *(QObject **)&this->field_0x8;
  if ((allowAuthenticationReuse) &&
     ((cVar2 = QUrl::isEmpty(), cVar2 != '\0' ||
      (cVar2 = comparesEqual(url,urlForLastAuthentication), cVar2 == '\0')))) {
    QUrl::userName(&local_88,url,0x7f00000);
    if ((QString *)local_88.domain.d.size == (QString *)0x0) {
      bVar3 = 0;
    }
    else {
      QUrl::password(&local_a0,url,0x7f00000);
      if ((undefined1 *)local_a0.d.size == (undefined1 *)0x0) {
        bVar3 = 0;
      }
      else {
        QUrl::userName(&local_b8,url,0x7f00000);
        QAuthenticator::user(&local_d0,authenticator);
        bVar3 = 1;
        if ((local_b8.d.size == local_d0.d.size) &&
           (QVar4.m_data = local_d0.d.ptr, QVar4.m_size = local_b8.d.size,
           QVar8.m_data = local_b8.d.ptr, QVar8.m_size = local_b8.d.size,
           cVar2 = QtPrivate::equalStrings(QVar8,QVar4), cVar2 != '\0')) {
          QUrl::password(&local_e8,url,0x7f00000);
          QAuthenticator::password(&local_100,authenticator);
          bVar3 = 1;
          if (local_d8 == local_100.d.size) {
            QVar5.m_data = local_100.d.ptr;
            QVar5.m_size = local_d8;
            QVar9.m_data = local_e0;
            QVar9.m_size = local_d8;
            bVar3 = QtPrivate::equalStrings(QVar9,QVar5);
            bVar3 = bVar3 ^ 1;
          }
          if (&(local_100.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_100.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_100.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
                 -1;
            UNLOCK();
            if (((local_100.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
               ) {
              QArrayData::deallocate(&(local_100.d.d)->super_QArrayData,2,0x10);
            }
          }
          if (local_e8 != (QArrayData *)0x0) {
            LOCK();
            (local_e8->ref_)._q_value.super___atomic_base<int>._M_i =
                 (local_e8->ref_)._q_value.super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if ((local_e8->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
              QArrayData::deallocate(local_e8,2,0x10);
            }
          }
        }
        if (&(local_d0.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_d0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_d0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_d0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_d0.d.d)->super_QArrayData,2,0x10);
          }
        }
        if (&(local_b8.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_b8.d.d)->super_QArrayData,2,0x10);
          }
        }
      }
      if (&(local_a0.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_a0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_a0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_a0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_a0.d.d)->super_QArrayData,2,0x10);
        }
      }
    }
    if (&(local_88.domain.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_88.domain.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_88.domain.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
           -1;
      UNLOCK();
      if (((local_88.domain.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
         ) {
        QArrayData::deallocate(&(local_88.domain.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (bVar3 == 0) {
      local_88.password.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      local_88.password.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      local_88.password.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
      local_88.user.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
      local_88.user.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      local_88.domain.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      local_88.user.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      local_88.domain.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      local_88.domain.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
      QNetworkAccessAuthenticationManager::fetchCachedCredentials
                (&local_88,
                 (this->authenticationManager).
                 super___shared_ptr<QNetworkAccessAuthenticationManager,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr,url,authenticator);
      if ((((QString *)local_88.domain.d.ptr != (QString *)0x0) ||
          (local_88.user.d.ptr != (storage_type_conflict *)0x0)) ||
         (local_88.password.d.ptr != (storage_type_conflict *)0x0)) {
        QAuthenticator::user(&local_a0,authenticator);
        bVar3 = 1;
        if ((local_88.user.d.size == local_a0.d.size) &&
           (QVar6.m_data = local_a0.d.ptr, QVar6.m_size = local_88.user.d.size,
           QVar10.m_data = local_88.user.d.ptr, QVar10.m_size = local_88.user.d.size,
           cVar2 = QtPrivate::equalStrings(QVar10,QVar6), cVar2 != '\0')) {
          QAuthenticator::password(&local_b8,authenticator);
          bVar3 = 1;
          if (local_88.password.d.size == local_b8.d.size) {
            QVar7.m_data = local_b8.d.ptr;
            QVar7.m_size = local_88.password.d.size;
            QVar11.m_data = local_88.password.d.ptr;
            QVar11.m_size = local_88.password.d.size;
            bVar3 = QtPrivate::equalStrings(QVar11,QVar7);
            bVar3 = bVar3 ^ 1;
          }
          if (&(local_b8.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1
            ;
            UNLOCK();
            if (((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
            {
              QArrayData::deallocate(&(local_b8.d.d)->super_QArrayData,2,0x10);
            }
          }
        }
        if (&(local_a0.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_a0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_a0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_a0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_a0.d.d)->super_QArrayData,2,0x10);
          }
        }
        if (bVar3 != 0) {
          QAuthenticator::setUser(authenticator,&local_88.user);
          QAuthenticator::setPassword(authenticator,&local_88.password);
          QUrl::operator=(urlForLastAuthentication,url);
          if (&(local_88.password.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_88.password.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                 = ((local_88.password.d.d)->super_QArrayData).ref_._q_value.
                   super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if (((local_88.password.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                _M_i == 0) {
              QArrayData::deallocate(&(local_88.password.d.d)->super_QArrayData,2,0x10);
            }
          }
          if (&(local_88.user.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_88.user.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_88.user.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                 + -1;
            UNLOCK();
            if (((local_88.user.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                == 0) {
              QArrayData::deallocate(&(local_88.user.d.d)->super_QArrayData,2,0x10);
            }
          }
          if (&(local_88.domain.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_88.domain.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_88.domain.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                 _M_i + -1;
            UNLOCK();
            if (((local_88.domain.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                _M_i == 0) {
              QArrayData::deallocate(&(local_88.domain.d.d)->super_QArrayData,2,0x10);
            }
          }
          goto LAB_001812d7;
        }
      }
      if (&(local_88.password.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_88.password.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_88.password.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
             + -1;
        UNLOCK();
        if (((local_88.password.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
            == 0) {
          QArrayData::deallocate(&(local_88.password.d.d)->super_QArrayData,2,0x10);
        }
      }
      if (&(local_88.user.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_88.user.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_88.user.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
             -1;
        UNLOCK();
        if (((local_88.user.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
           ) {
          QArrayData::deallocate(&(local_88.user.d.d)->super_QArrayData,2,0x10);
        }
      }
      if (&(local_88.domain.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_88.domain.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_88.domain.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
             -1;
        UNLOCK();
        if (((local_88.domain.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
            0) {
          QArrayData::deallocate(&(local_88.domain.d.d)->super_QArrayData,2,0x10);
        }
      }
      goto LAB_0018126e;
    }
    QUrl::userName(&local_88,url,0x7f00000);
    QAuthenticator::setUser(authenticator,&local_88.domain);
    if (&(local_88.domain.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_88.domain.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_88.domain.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
           -1;
      UNLOCK();
      if (((local_88.domain.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
         ) {
        QArrayData::deallocate(&(local_88.domain.d.d)->super_QArrayData,2,0x10);
      }
    }
    QUrl::password(&local_88,url,0x7f00000);
    QAuthenticator::setPassword(authenticator,&local_88.domain);
    if (&(local_88.domain.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_88.domain.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_88.domain.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
           -1;
      UNLOCK();
      if (((local_88.domain.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
         ) {
        QArrayData::deallocate(&(local_88.domain.d.d)->super_QArrayData,2,0x10);
      }
    }
    QUrl::operator=(urlForLastAuthentication,url);
  }
  else {
LAB_0018126e:
    if (synchronous) goto LAB_001812d7;
    QUrl::operator=(urlForLastAuthentication,url);
    local_88.domain.d.ptr = (char16_t *)&local_a0;
    local_88.domain.d.size = (qsizetype)&local_b8;
    local_88.domain.d.d = (Data *)0x0;
    local_b8.d.d = (Data *)authenticator;
    local_a0.d.d = (Data *)reply;
    QMetaObject::activate(pQVar1,&QNetworkAccessManager::staticMetaObject,1,(void **)&local_88);
    if (!allowAuthenticationReuse) goto LAB_001812d7;
  }
  QNetworkAccessAuthenticationManager::cacheCredentials
            ((this->authenticationManager).
             super___shared_ptr<QNetworkAccessAuthenticationManager,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr,url,authenticator);
LAB_001812d7:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QNetworkAccessManagerPrivate::authenticationRequired(QAuthenticator *authenticator,
                                                          QNetworkReply *reply,
                                                          bool synchronous,
                                                          QUrl &url,
                                                          QUrl *urlForLastAuthentication,
                                                          bool allowAuthenticationReuse)
{
    Q_Q(QNetworkAccessManager);

    // don't try the cache for the same URL twice in a row
    // being called twice for the same URL means the authentication failed
    // also called when last URL is empty, e.g. on first call
    if (allowAuthenticationReuse && (urlForLastAuthentication->isEmpty()
            || url != *urlForLastAuthentication)) {
        // if credentials are included in the url, then use them, unless they were already used
        if (!url.userName().isEmpty() && !url.password().isEmpty()
            && (url.userName() != authenticator->user()
                || url.password() != authenticator->password())) {
            authenticator->setUser(url.userName(QUrl::FullyDecoded));
            authenticator->setPassword(url.password(QUrl::FullyDecoded));
            *urlForLastAuthentication = url;
            authenticationManager->cacheCredentials(url, authenticator);
            return;
        }

        QNetworkAuthenticationCredential cred = authenticationManager->fetchCachedCredentials(url, authenticator);
        if (!cred.isNull()
            && (cred.user != authenticator->user() || cred.password != authenticator->password())) {
            authenticator->setUser(cred.user);
            authenticator->setPassword(cred.password);
            *urlForLastAuthentication = url;
            return;
        }
    }

    // if we emit a signal here in synchronous mode, the user might spin
    // an event loop, which might recurse and lead to problems
    if (synchronous)
        return;

    *urlForLastAuthentication = url;
    emit q->authenticationRequired(reply, authenticator);
    if (allowAuthenticationReuse)
        authenticationManager->cacheCredentials(url, authenticator);
}